

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<false>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  Token *pTVar1;
  size_t sVar2;
  Dictionary *pDVar3;
  pointer ppVar4;
  size_t sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  unsigned_short uVar9;
  CharInfo CVar10;
  int iVar11;
  CharInfo CVar12;
  uint uVar13;
  CharInfo CVar14;
  mecab_node_t *pmVar15;
  char *pcVar16;
  result_pair_type *prVar17;
  pointer ppDVar18;
  char *pcVar19;
  long lVar20;
  mecab_node_t *pmVar21;
  char *pcVar22;
  ulong uVar23;
  char *pcVar24;
  uint *puVar25;
  undefined1 auVar26 [16];
  size_t mblen;
  size_t local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  CharProperty *local_60;
  result_pair_type *local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  local_80 = 0;
  pcVar16 = begin + 0xffff;
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    pcVar16 = end;
  }
  local_60 = &this->property_;
  pcVar22 = begin;
  if (pcVar16 == begin) {
    CVar10 = (CharInfo)0x0;
  }
  else {
    CVar14 = this->space_;
    do {
      CVar10 = CharProperty::getCharInfo(local_60,pcVar22,pcVar16,&local_80);
      if (((uint)CVar14 & (uint)CVar10 & 0x3ffff) == 0) break;
      pcVar22 = pcVar22 + local_80;
      CVar14 = CVar10;
    } while (pcVar22 != pcVar16);
  }
  ppDVar18 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_78 = pcVar16;
  local_68 = begin;
  if (ppDVar18 ==
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pmVar15 = (mecab_node_t *)0x0;
  }
  else {
    prVar17 = (allocator->results_).ptr_;
    local_38 = (long)pcVar16 - (long)pcVar22;
    local_40 = (long)pcVar22 - (long)begin;
    pmVar15 = (mecab_node_t *)0x0;
    local_48 = CONCAT44(local_48._4_4_,(uint)CVar10 >> 0x12);
    local_58 = prVar17;
    do {
      local_50 = (char *)Darts::
                         DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                         ::
                         commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
                                   ((DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                                     *)&(*ppDVar18)->da_,pcVar22,prVar17,0x200,local_38,0);
      if (local_50 != (char *)0x0) {
        pcVar16 = (char *)0x0;
        do {
          uVar13 = prVar17[(long)pcVar16].value;
          local_70 = pcVar16;
          if ((uVar13 & 0xff) != 0) {
            iVar11 = (int)uVar13 >> 8;
            pTVar1 = (*ppDVar18)->token_;
            uVar23 = 0;
            pmVar21 = pmVar15;
            do {
              pmVar15 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
              pmVar15->prev = (mecab_node_t *)0x0;
              pmVar15->next = (mecab_node_t *)0x0;
              pmVar15->enext = (mecab_node_t *)0x0;
              pmVar15->bnext = (mecab_node_t *)0x0;
              pmVar15->rpath = (mecab_path_t *)0x0;
              pmVar15->lpath = (mecab_path_t *)0x0;
              pmVar15->surface = (char *)0x0;
              pmVar15->feature = (char *)0x0;
              pmVar15->id = 0;
              pmVar15->length = 0;
              pmVar15->rlength = 0;
              pmVar15->rcAttr = 0;
              pmVar15->lcAttr = 0;
              pmVar15->posid = 0;
              pmVar15->char_type = '\0';
              pmVar15->stat = '\0';
              pmVar15->isbest = '\0';
              *(undefined3 *)&pmVar15->field_0x51 = 0;
              pmVar15->alpha = 0.0;
              pmVar15->beta = 0.0;
              pmVar15->prob = 0.0;
              *(undefined8 *)&pmVar15->wcost = 0;
              pmVar15->cost = 0;
              sVar2 = allocator->id_;
              allocator->id_ = sVar2 + 1;
              pmVar15->id = (uint)sVar2;
              pDVar3 = *ppDVar18;
              auVar26 = ZEXT416(*(uint *)((long)&pTVar1[iVar11].lcAttr + uVar23));
              auVar26 = pshuflw(auVar26,auVar26,0xe1);
              pmVar15->rcAttr = (short)auVar26._0_4_;
              pmVar15->lcAttr = (short)((uint)auVar26._0_4_ >> 0x10);
              pmVar15->posid = *(unsigned_short *)((long)&pTVar1[iVar11].posid + uVar23);
              pmVar15->wcost = *(short *)((long)&pTVar1[iVar11].wcost + uVar23);
              pmVar15->feature =
                   pDVar3->feature_ + *(uint *)((long)&pTVar1[iVar11].feature + uVar23);
              uVar9 = (unsigned_short)prVar17[(long)pcVar16].length;
              pmVar15->length = uVar9;
              pmVar15->rlength = uVar9 + (short)local_40;
              pmVar15->surface = pcVar22;
              pmVar15->stat = '\0';
              pmVar15->char_type = (uchar)local_48;
              pmVar15->bnext = pmVar21;
              uVar23 = uVar23 + 0x10;
              pmVar21 = pmVar15;
            } while ((uVar13 & 0xff) << 4 != uVar23);
          }
          pcVar16 = local_70 + 1;
          prVar17 = local_58;
        } while (pcVar16 != local_50);
      }
      ppDVar18 = ppDVar18 + 1;
    } while (ppDVar18 !=
             (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  sVar2 = local_80;
  if (((int)CVar10 < 0) || (pmVar15 == (mecab_node_t *)0x0)) {
    pcVar16 = pcVar22 + local_80;
    if (local_78 < pcVar16) {
      ppVar4 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
      lVar20 = *(long *)((long)&ppVar4->second + uVar23);
      if (lVar20 != 0) {
        sVar6 = (short)local_68;
        puVar25 = (uint *)(*(long *)((long)&ppVar4->first + uVar23) + 8);
        pmVar21 = pmVar15;
        do {
          pmVar15 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
          pmVar15->prev = (mecab_node_t *)0x0;
          pmVar15->next = (mecab_node_t *)0x0;
          pmVar15->enext = (mecab_node_t *)0x0;
          pmVar15->bnext = (mecab_node_t *)0x0;
          pmVar15->rpath = (mecab_path_t *)0x0;
          pmVar15->lpath = (mecab_path_t *)0x0;
          pmVar15->surface = (char *)0x0;
          pmVar15->feature = (char *)0x0;
          pmVar15->id = 0;
          pmVar15->length = 0;
          pmVar15->rlength = 0;
          pmVar15->rcAttr = 0;
          pmVar15->lcAttr = 0;
          pmVar15->posid = 0;
          pmVar15->char_type = '\0';
          pmVar15->stat = '\0';
          pmVar15->isbest = '\0';
          *(undefined3 *)&pmVar15->field_0x51 = 0;
          pmVar15->alpha = 0.0;
          pmVar15->beta = 0.0;
          pmVar15->prob = 0.0;
          pmVar15->wcost = 0;
          *(undefined6 *)&pmVar15->field_0x62 = 0;
          pmVar15->cost = 0;
          sVar5 = allocator->id_;
          allocator->id_ = sVar5 + 1;
          pmVar15->id = (uint)sVar5;
          auVar26 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
          pmVar15->rcAttr = (short)auVar26._0_4_;
          pmVar15->lcAttr = (short)((uint)auVar26._0_4_ >> 0x10);
          pmVar15->posid = (unsigned_short)puVar25[-1];
          pmVar15->wcost = *(short *)((long)puVar25 + -2);
          pmVar15->feature = (this->unkdic_).feature_ + *puVar25;
          pmVar15->char_type = (uchar)((uint)CVar10 >> 0x12);
          pmVar15->surface = pcVar22;
          pmVar15->length = (unsigned_short)sVar2;
          pmVar15->rlength = (short)pcVar16 - sVar6;
          pmVar15->stat = '\x01';
          pmVar15->bnext = pmVar21;
          pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
          if (pcVar19 != (char *)0x0) {
            pmVar15->feature = pcVar19;
          }
          puVar25 = puVar25 + 4;
          lVar20 = lVar20 + -1;
          pmVar21 = pmVar15;
        } while (lVar20 != 0);
      }
      if (pmVar15 != (mecab_node_t *)0x0) {
        return pmVar15;
      }
      pmVar15 = (mecab_node_t *)0x0;
    }
    pcVar19 = local_78;
    sVar6 = (short)pcVar22;
    if (((uint)CVar10 >> 0x1e & 1) == 0) {
      pcVar24 = (char *)0x0;
    }
    else {
      pcVar24 = pcVar16;
      if (pcVar16 == local_78) {
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        CVar14 = CVar10;
        do {
          CVar12 = CharProperty::getCharInfo(local_60,pcVar24,pcVar19,&local_80);
          if (((uint)CVar14 & (uint)CVar12 & 0x3ffff) == 0) break;
          pcVar24 = pcVar24 + local_80;
          uVar23 = uVar23 + 1;
          CVar14 = CVar12;
        } while (pcVar24 != pcVar19);
      }
      if (uVar23 <= this->max_grouping_size_) {
        ppVar4 = (this->unk_tokens_).
                 super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar23 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
        lVar20 = *(long *)((long)&ppVar4->second + uVar23);
        if (lVar20 != 0) {
          sVar8 = (short)pcVar24;
          sVar7 = (short)local_68;
          puVar25 = (uint *)(*(long *)((long)&ppVar4->first + uVar23) + 8);
          pmVar21 = pmVar15;
          local_70 = pcVar24;
          do {
            pmVar15 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
            pmVar15->prev = (mecab_node_t *)0x0;
            pmVar15->next = (mecab_node_t *)0x0;
            pmVar15->enext = (mecab_node_t *)0x0;
            pmVar15->bnext = (mecab_node_t *)0x0;
            pmVar15->rpath = (mecab_path_t *)0x0;
            pmVar15->lpath = (mecab_path_t *)0x0;
            pmVar15->surface = (char *)0x0;
            pmVar15->feature = (char *)0x0;
            pmVar15->id = 0;
            pmVar15->length = 0;
            pmVar15->rlength = 0;
            pmVar15->rcAttr = 0;
            pmVar15->lcAttr = 0;
            pmVar15->posid = 0;
            pmVar15->char_type = '\0';
            pmVar15->stat = '\0';
            pmVar15->isbest = '\0';
            *(undefined3 *)&pmVar15->field_0x51 = 0;
            pmVar15->alpha = 0.0;
            pmVar15->beta = 0.0;
            pmVar15->prob = 0.0;
            pmVar15->wcost = 0;
            *(undefined6 *)&pmVar15->field_0x62 = 0;
            pmVar15->cost = 0;
            sVar2 = allocator->id_;
            allocator->id_ = sVar2 + 1;
            pmVar15->id = (uint)sVar2;
            auVar26 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
            pmVar15->rcAttr = (short)auVar26._0_4_;
            pmVar15->lcAttr = (short)((uint)auVar26._0_4_ >> 0x10);
            pmVar15->posid = (unsigned_short)puVar25[-1];
            pmVar15->wcost = *(short *)((long)puVar25 + -2);
            pmVar15->feature = (this->unkdic_).feature_ + *puVar25;
            pmVar15->char_type = (uchar)((uint)CVar10 >> 0x12);
            pmVar15->surface = pcVar22;
            pmVar15->length = sVar8 - sVar6;
            pmVar15->rlength = sVar8 - sVar7;
            pmVar15->stat = '\x01';
            pmVar15->bnext = pmVar21;
            pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar19 != (char *)0x0) {
              pmVar15->feature = pcVar19;
            }
            puVar25 = puVar25 + 4;
            lVar20 = lVar20 + -1;
            pcVar19 = local_78;
            pcVar24 = local_70;
            pmVar21 = pmVar15;
          } while (lVar20 != 0);
        }
      }
    }
    uVar13 = (uint)CVar10 >> 0x1a & 0xf;
    local_48 = (ulong)uVar13;
    if ((uVar13 != 0) && (pcVar16 <= pcVar19)) {
      local_50 = (char *)(CONCAT44(local_50._4_4_,CVar10) & 0xffffffff0003ffff);
      uVar23 = 1;
      prVar17 = (result_pair_type *)(ulong)(((uint)CVar10 >> 0x12 & 0xff) << 4);
      local_70 = pcVar24;
      local_58 = prVar17;
      do {
        if (pcVar16 != pcVar24) {
          ppVar4 = (this->unk_tokens_).
                   super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = *(long *)((long)&prVar17->length + (long)ppVar4);
          local_40 = uVar23;
          if (lVar20 != 0) {
            sVar7 = (short)local_68;
            puVar25 = (uint *)(*(long *)((long)&prVar17->value + (long)ppVar4) + 8);
            pmVar21 = pmVar15;
            do {
              pmVar15 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
              pmVar15->prev = (mecab_node_t *)0x0;
              pmVar15->next = (mecab_node_t *)0x0;
              pmVar15->enext = (mecab_node_t *)0x0;
              pmVar15->bnext = (mecab_node_t *)0x0;
              pmVar15->rpath = (mecab_path_t *)0x0;
              pmVar15->lpath = (mecab_path_t *)0x0;
              pmVar15->surface = (char *)0x0;
              pmVar15->feature = (char *)0x0;
              pmVar15->id = 0;
              pmVar15->length = 0;
              pmVar15->rlength = 0;
              pmVar15->rcAttr = 0;
              pmVar15->lcAttr = 0;
              pmVar15->posid = 0;
              pmVar15->char_type = '\0';
              pmVar15->stat = '\0';
              pmVar15->isbest = '\0';
              *(undefined3 *)&pmVar15->field_0x51 = 0;
              pmVar15->alpha = 0.0;
              pmVar15->beta = 0.0;
              pmVar15->prob = 0.0;
              pmVar15->wcost = 0;
              *(undefined6 *)&pmVar15->field_0x62 = 0;
              pmVar15->cost = 0;
              sVar2 = allocator->id_;
              allocator->id_ = sVar2 + 1;
              pmVar15->id = (uint)sVar2;
              auVar26 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
              pmVar15->rcAttr = (short)auVar26._0_4_;
              pmVar15->lcAttr = (short)((uint)auVar26._0_4_ >> 0x10);
              pmVar15->posid = (unsigned_short)puVar25[-1];
              pmVar15->wcost = *(short *)((long)puVar25 + -2);
              pmVar15->feature = (this->unkdic_).feature_ + *puVar25;
              pmVar15->char_type = (uchar)((uint)CVar10 >> 0x12);
              pmVar15->surface = pcVar22;
              pmVar15->length = (short)pcVar16 - sVar6;
              pmVar15->rlength = (short)pcVar16 - sVar7;
              pmVar15->stat = '\x01';
              pmVar15->bnext = pmVar21;
              pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
              if (pcVar19 != (char *)0x0) {
                pmVar15->feature = pcVar19;
              }
              puVar25 = puVar25 + 4;
              lVar20 = lVar20 + -1;
              pmVar21 = pmVar15;
            } while (lVar20 != 0);
          }
          CVar14 = CharProperty::getCharInfo(local_60,pcVar16,local_78,&local_80);
          if (((uint)local_50 & (uint)CVar14) == 0) break;
          pcVar16 = pcVar16 + local_80;
          uVar23 = local_40;
          prVar17 = local_58;
          pcVar19 = local_78;
          pcVar24 = local_70;
        }
        if ((local_48 <= uVar23) || (uVar23 = uVar23 + 1, pcVar19 < pcVar16)) break;
      } while( true );
    }
    if (pmVar15 == (mecab_node_t *)0x0) {
      ppVar4 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
      lVar20 = *(long *)((long)&ppVar4->second + uVar23);
      if (lVar20 == 0) {
        pmVar15 = (mecab_node_t *)0x0;
      }
      else {
        sVar7 = (short)local_68;
        puVar25 = (uint *)(*(long *)((long)&ppVar4->first + uVar23) + 8);
        pmVar21 = (mecab_node_t *)0x0;
        do {
          pmVar15 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
          pmVar15->prev = (mecab_node_t *)0x0;
          pmVar15->next = (mecab_node_t *)0x0;
          pmVar15->enext = (mecab_node_t *)0x0;
          pmVar15->bnext = (mecab_node_t *)0x0;
          pmVar15->rpath = (mecab_path_t *)0x0;
          pmVar15->lpath = (mecab_path_t *)0x0;
          pmVar15->surface = (char *)0x0;
          pmVar15->feature = (char *)0x0;
          pmVar15->id = 0;
          pmVar15->length = 0;
          pmVar15->rlength = 0;
          pmVar15->rcAttr = 0;
          pmVar15->lcAttr = 0;
          pmVar15->posid = 0;
          pmVar15->char_type = '\0';
          pmVar15->stat = '\0';
          pmVar15->isbest = '\0';
          *(undefined3 *)&pmVar15->field_0x51 = 0;
          pmVar15->alpha = 0.0;
          pmVar15->beta = 0.0;
          pmVar15->prob = 0.0;
          pmVar15->wcost = 0;
          *(undefined6 *)&pmVar15->field_0x62 = 0;
          pmVar15->cost = 0;
          sVar2 = allocator->id_;
          allocator->id_ = sVar2 + 1;
          pmVar15->id = (uint)sVar2;
          auVar26 = pshuflw(ZEXT416(puVar25[-2]),ZEXT416(puVar25[-2]),0xe1);
          pmVar15->rcAttr = (short)auVar26._0_4_;
          pmVar15->lcAttr = (short)((uint)auVar26._0_4_ >> 0x10);
          pmVar15->posid = (unsigned_short)puVar25[-1];
          pmVar15->wcost = *(short *)((long)puVar25 + -2);
          pmVar15->feature = (this->unkdic_).feature_ + *puVar25;
          pmVar15->char_type = (uchar)((uint)CVar10 >> 0x12);
          pmVar15->surface = pcVar22;
          pmVar15->length = (short)pcVar16 - sVar6;
          pmVar15->rlength = (short)pcVar16 - sVar7;
          pmVar15->stat = '\x01';
          pmVar15->bnext = pmVar21;
          pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
          if (pcVar19 != (char *)0x0) {
            pmVar15->feature = pcVar19;
          }
          puVar25 = puVar25 + 4;
          lVar20 = lVar20 + -1;
          pmVar21 = pmVar15;
        } while (lVar20 != 0);
      }
    }
  }
  return pmVar15;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}